

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_int_t ngx_radix32tree_insert(ngx_radix_tree_t *tree,uint32_t key,uint32_t mask,uintptr_t value)

{
  ngx_radix_node_t *pnVar1;
  ngx_radix_node_t *pnVar2;
  uint uVar3;
  
  pnVar2 = tree->root;
  if ((int)mask < 0) {
    uVar3 = 0x80000000;
    pnVar1 = pnVar2;
    do {
      pnVar2 = (&pnVar1->right)[(uVar3 & key) == 0];
      if (pnVar2 == (ngx_radix_node_t *)0x0) goto joined_r0x0011dcc6;
      uVar3 = uVar3 >> 1;
      pnVar1 = pnVar2;
    } while ((uVar3 & mask) != 0);
  }
  else if (pnVar2 == (ngx_radix_node_t *)0x0) {
    uVar3 = 0x80000000;
    pnVar1 = (ngx_radix_node_t *)0x0;
joined_r0x0011dcc6:
    for (; pnVar2 = pnVar1, (uVar3 & mask) != 0; uVar3 = uVar3 >> 1) {
      pnVar1 = ngx_radix_alloc(tree);
      if (pnVar1 == (ngx_radix_node_t *)0x0) {
        return -1;
      }
      pnVar1->right = (ngx_radix_node_t *)0x0;
      pnVar1->left = (ngx_radix_node_t *)0x0;
      pnVar1->parent = pnVar2;
      pnVar1->value = 0xffffffffffffffff;
      (&pnVar2->right)[(uVar3 & key) == 0] = pnVar1;
    }
    goto LAB_0011dd44;
  }
  if (pnVar2->value != 0xffffffffffffffff) {
    return -3;
  }
LAB_0011dd44:
  pnVar2->value = value;
  return 0;
}

Assistant:

ngx_int_t
ngx_radix32tree_insert(ngx_radix_tree_t *tree, uint32_t key, uint32_t mask,
    uintptr_t value)
{
    uint32_t           bit;
    ngx_radix_node_t  *node, *next;

    bit = 0x80000000;

    node = tree->root;
    next = tree->root;

    while (bit & mask) {
        if (key & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;
    }

    node->value = value;

    return NGX_OK;
}